

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
slang::function_ref<std::__cxx11::string()>::
callback_fn<slang::syntax::SyntaxTree::create(slang::SourceManager&,std::span<slang::SourceBuffer_const,18446744073709551615ul>,slang::Bag_const&,std::span<slang::syntax::DefineDirectiveSyntax_const*const,18446744073709551615ul>,bool)::__0>
          (intptr_t callable)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  anon_class_16_2_4749af83 *in_stack_00000038;
  
  slang::syntax::SyntaxTree::
  create(slang::SourceManager&,std::span<slang::SourceBuffer_const,18446744073709551615ul>,slang::Bag_const&,std::span<slang::syntax::DefineDirectiveSyntax_const*const,18446744073709551615ul>,bool)
  ::$_0::operator()[abi_cxx11_(in_stack_00000038);
  return in_RDI;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }